

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O3

KBOOL __thiscall KDIS::DATA_TYPE::IFF_Layer2::operator==(IFF_Layer2 *this,IFF_Layer2 *Value)

{
  pointer pIVar1;
  KBOOL KVar2;
  pointer this_00;
  pointer Value_00;
  
  KVar2 = LayerHeader::operator!=(&this->super_LayerHeader,&Value->super_LayerHeader);
  if (((!KVar2) && (KVar2 = BeamData::operator!=(&this->m_BmDt,&Value->m_BmDt), !KVar2)) &&
     (KVar2 = SecondaryOperationalData::operator!=(&this->m_SOD,&Value->m_SOD), !KVar2)) {
    this_00 = (this->m_vFPD).
              super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = (this->m_vFPD).
             super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    Value_00 = (Value->m_vFPD).
               super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pIVar1 - (long)this_00 ==
        (long)(Value->m_vFPD).
              super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)Value_00) {
      if (this_00 == pIVar1) {
        return true;
      }
      do {
        KVar2 = IFF_ATC_NAVAIDS_FundamentalParameterData::operator==(this_00,Value_00);
        if (!KVar2) break;
        this_00 = this_00 + 1;
        Value_00 = Value_00 + 1;
      } while (this_00 != pIVar1);
      if (KVar2) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

KBOOL IFF_Layer2::operator == ( const IFF_Layer2 & Value ) const
{
    if( LayerHeader::operator !=( Value ) )     return false;    
    if( m_BmDt                != Value.m_BmDt ) return false;
    if( m_SOD                 != Value.m_SOD )  return false;
	if( m_vFPD                != Value.m_vFPD ) return false;
    return true;
}